

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O1

lzma_ret lzma_raw_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *options,
                            lzma_filter_find coder_find,_Bool is_encoder)

{
  lzma_init_function p_Var1;
  ulong uVar2;
  lzma_next_coder *next_00;
  lzma_allocator *allocator_00;
  lzma_ret lVar3;
  lzma_filter_coder *plVar4;
  void **ppvVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  size_t count;
  lzma_filter_info filters [5];
  ulong local_c0;
  lzma_next_coder *local_b8;
  lzma_allocator *local_b0;
  lzma_filter_info local_a8 [5];
  
  lVar3 = validate_chain(options,&local_c0);
  uVar2 = local_c0;
  if (lVar3 == LZMA_OK) {
    bVar7 = local_c0 != 0;
    local_b8 = next;
    local_b0 = allocator;
    if (is_encoder) {
      if (local_c0 != 0) {
        ppvVar5 = &local_a8[local_c0 - 1].options;
        uVar6 = 1;
        do {
          plVar4 = (*coder_find)(options->id);
          if ((plVar4 == (lzma_filter_coder *)0x0) ||
             (p_Var1 = plVar4->init, p_Var1 == (lzma_init_function)0x0)) {
            bVar8 = false;
            lVar3 = LZMA_OPTIONS_ERROR;
          }
          else {
            ((lzma_filter_info *)(ppvVar5 + -2))->id = options->id;
            ppvVar5[-1] = p_Var1;
            *ppvVar5 = options->options;
            bVar8 = true;
          }
          if (!bVar8) break;
          bVar7 = uVar6 < uVar2;
          options = options + 1;
          ppvVar5 = ppvVar5 + -3;
          bVar8 = uVar6 != uVar2;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
    }
    else if (local_c0 != 0) {
      ppvVar5 = &local_a8[0].options;
      uVar6 = 1;
      do {
        plVar4 = (*coder_find)(options->id);
        if ((plVar4 == (lzma_filter_coder *)0x0) ||
           (p_Var1 = plVar4->init, p_Var1 == (lzma_init_function)0x0)) {
          bVar8 = false;
          lVar3 = LZMA_OPTIONS_ERROR;
        }
        else {
          ((lzma_filter_info *)(ppvVar5 + -2))->id = options->id;
          ppvVar5[-1] = p_Var1;
          *ppvVar5 = options->options;
          bVar8 = true;
        }
        if (!bVar8) break;
        bVar7 = uVar6 < uVar2;
        ppvVar5 = ppvVar5 + 3;
        options = options + 1;
        bVar8 = uVar6 != uVar2;
        uVar6 = uVar6 + 1;
      } while (bVar8);
    }
    allocator_00 = local_b0;
    next_00 = local_b8;
    if (!bVar7) {
      local_a8[local_c0].id = 0xffffffffffffffff;
      local_a8[local_c0].init = (lzma_init_function)0x0;
      lVar3 = lzma_next_filter_init(local_b8,local_b0,local_a8);
      if (lVar3 != LZMA_OK) {
        lzma_next_end(next_00,allocator_00);
      }
    }
  }
  return lVar3;
}

Assistant:

extern lzma_ret
lzma_raw_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter *options,
		lzma_filter_find coder_find, bool is_encoder)
{
	// Do some basic validation and get the number of filters.
	size_t count;
	return_if_error(validate_chain(options, &count));

	// Set the filter functions and copy the options pointer.
	lzma_filter_info filters[LZMA_FILTERS_MAX + 1];
	if (is_encoder) {
		for (size_t i = 0; i < count; ++i) {
			// The order of the filters is reversed in the
			// encoder. It allows more efficient handling
			// of the uncompressed data.
			const size_t j = count - i - 1;

			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[j].id = options[i].id;
			filters[j].init = fc->init;
			filters[j].options = options[i].options;
		}
	} else {
		for (size_t i = 0; i < count; ++i) {
			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[i].id = options[i].id;
			filters[i].init = fc->init;
			filters[i].options = options[i].options;
		}
	}

	// Terminate the array.
	filters[count].id = LZMA_VLI_UNKNOWN;
	filters[count].init = NULL;

	// Initialize the filters.
	const lzma_ret ret = lzma_next_filter_init(next, allocator, filters);
	if (ret != LZMA_OK)
		lzma_next_end(next, allocator);

	return ret;
}